

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

bool __thiscall slang::ast::Type::isFourState(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  SyntaxNode *pSVar3;
  bool bVar4;
  Type *pTVar5;
  long lVar6;
  bool bVar7;
  
  while( true ) {
    pTVar5 = this->canonical;
    if (pTVar5 == (Type *)0x0) {
      this->canonical = this;
      pTVar5 = this;
      do {
        pTVar5 = DeclaredType::getType((DeclaredType *)(pTVar5 + 1));
        this->canonical = pTVar5;
      } while ((pTVar5->super_Symbol).kind == TypeAlias);
    }
    bVar4 = isIntegral(pTVar5);
    if (bVar4) break;
    bVar4 = isArray(pTVar5);
    if (!bVar4) {
      SVar1 = (pTVar5->super_Symbol).kind;
      if (SVar1 == UnpackedUnionType) {
        pTVar2 = pTVar5[1].canonical;
        if (pTVar2 != (Type *)0x0) {
          pSVar3 = pTVar5[1].super_Symbol.originatingSyntax;
          lVar6 = 0;
          do {
            pTVar5 = DeclaredType::getType
                               ((DeclaredType *)(*(long *)((long)&pSVar3->kind + lVar6) + 0x40));
            bVar4 = isFourState(pTVar5);
            if (bVar4) {
              return bVar4;
            }
            bVar7 = (long)pTVar2 * 8 + -8 != lVar6;
            lVar6 = lVar6 + 8;
          } while (bVar7);
          return bVar4;
        }
      }
      else if ((SVar1 == UnpackedStructType) &&
              (pTVar2 = pTVar5[1].canonical, pTVar2 != (Type *)0x0)) {
        pSVar3 = pTVar5[1].super_Symbol.originatingSyntax;
        lVar6 = 0;
        do {
          pTVar5 = DeclaredType::getType
                             ((DeclaredType *)(*(long *)((long)&pSVar3->kind + lVar6) + 0x40));
          bVar4 = isFourState(pTVar5);
          if (bVar4) {
            return bVar4;
          }
          bVar7 = (long)pTVar2 * 8 + -8 != lVar6;
          lVar6 = lVar6 + 8;
        } while (bVar7);
        return bVar4;
      }
      return false;
    }
    this = getArrayElementType(pTVar5);
  }
  return (bool)pTVar5[1].super_Symbol.field_0x5;
}

Assistant:

bool Type::isFourState() const {
    const Type& ct = getCanonicalType();
    if (ct.isIntegral())
        return ct.as<IntegralType>().isFourState;

    if (ct.isArray())
        return ct.getArrayElementType()->isFourState();

    switch (ct.kind) {
        case SymbolKind::UnpackedStructType: {
            auto& us = ct.as<UnpackedStructType>();
            for (auto field : us.fields) {
                if (field->getType().isFourState())
                    return true;
            }
            return false;
        }
        case SymbolKind::UnpackedUnionType: {
            auto& us = ct.as<UnpackedUnionType>();
            for (auto field : us.fields) {
                if (field->getType().isFourState())
                    return true;
            }
            return false;
        }
        default:
            return false;
    }
}